

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Netlist.h
# Opt level: O2

void __thiscall
netlist::NetlistVariableDeclaration::~NetlistVariableDeclaration(NetlistVariableDeclaration *this)

{
  ~NetlistVariableDeclaration(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

NetlistVariableDeclaration(const ast::Symbol& symbol) :
        NetlistNode(NodeKind::VariableDeclaration, symbol) {}